

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

SrcList * sqlite3SrcListDup(sqlite3 *db,SrcList *p,int flags)

{
  u32 uVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  SrcList *pSVar6;
  char *pcVar7;
  ExprList *pEVar8;
  Select *pSVar9;
  Expr *pEVar10;
  long lVar11;
  long lVar12;
  
  if (p != (SrcList *)0x0) {
    iVar4 = 0x70;
    if (0 < p->nSrc) {
      iVar4 = p->nSrc * 0x68 + 8;
    }
    pSVar6 = (SrcList *)sqlite3DbMallocRawNN(db,(long)iVar4);
    if (pSVar6 != (SrcList *)0x0) {
      uVar1 = p->nSrc;
      pSVar6->nAlloc = uVar1;
      pSVar6->nSrc = uVar1;
      if ((int)uVar1 < 1) {
        return pSVar6;
      }
      lVar12 = 0x68;
      lVar11 = 0;
      do {
        *(undefined8 *)((long)(pSVar6->a + -1) + lVar12) =
             *(undefined8 *)((long)(p->a + -1) + lVar12);
        pcVar7 = sqlite3DbStrDup(db,*(char **)((long)p->a + lVar12 + -0x60));
        *(char **)((long)pSVar6->a + lVar12 + -0x60) = pcVar7;
        pcVar7 = sqlite3DbStrDup(db,*(char **)((long)p->a + lVar12 + -0x58));
        *(char **)((long)pSVar6->a + lVar12 + -0x58) = pcVar7;
        pcVar7 = sqlite3DbStrDup(db,*(char **)((long)p->a + lVar12 + -0x50));
        *(char **)((long)pSVar6->a + lVar12 + -0x50) = pcVar7;
        uVar5 = *(uint *)((long)p->a + lVar12 + -0x2c);
        *(uint *)((long)pSVar6->a + lVar12 + -0x2c) = uVar5;
        *(undefined4 *)((long)pSVar6->a + lVar12 + -0x28) =
             *(undefined4 *)((long)p->a + lVar12 + -0x28);
        *(undefined8 *)((long)pSVar6->a + lVar12 + -0x38) =
             *(undefined8 *)((long)p->a + lVar12 + -0x38);
        uVar5 = uVar5 >> 8;
        if ((uVar5 & 2) != 0) {
          pcVar7 = sqlite3DbStrDup(db,*(char **)((long)p->a + lVar12 + -0x10));
          *(char **)((long)pSVar6->a + lVar12 + -0x10) = pcVar7;
          uVar5 = (uint)*(ushort *)((long)pSVar6->a + lVar12 + -0x2b);
        }
        piVar2 = *(int **)((long)p->a + lVar12 + -8);
        *(int **)((long)pSVar6->a + lVar12 + -8) = piVar2;
        if ((uVar5 >> 8 & 1) != 0) {
          *piVar2 = *piVar2 + 1;
          uVar5 = (uint)*(ushort *)((long)pSVar6->a + lVar12 + -0x2b);
        }
        if ((uVar5 & 4) != 0) {
          pEVar8 = sqlite3ExprListDup(db,*(ExprList **)((long)p->a + lVar12 + -0x10),flags);
          *(ExprList **)((long)pSVar6->a + lVar12 + -0x10) = pEVar8;
        }
        lVar3 = *(long *)((long)p->a + lVar12 + -0x48);
        *(long *)((long)pSVar6->a + lVar12 + -0x48) = lVar3;
        if (lVar3 != 0) {
          *(int *)(lVar3 + 0x2c) = *(int *)(lVar3 + 0x2c) + 1;
        }
        pSVar9 = sqlite3SelectDup(db,*(Select **)((long)p->a + lVar12 + -0x40),flags);
        *(Select **)((long)pSVar6->a + lVar12 + -0x40) = pSVar9;
        pEVar10 = *(Expr **)((long)p->a + lVar12 + -0x20);
        if ((*(byte *)((long)p->a + lVar12 + -0x2a) & 4) == 0) {
          if (pEVar10 == (Expr *)0x0) {
            pEVar10 = (Expr *)0x0;
          }
          else {
            pEVar10 = exprDup(db,pEVar10,flags,(u8 **)0x0);
          }
        }
        else {
          pEVar10 = (Expr *)sqlite3IdListDup(db,(IdList *)pEVar10);
        }
        *(Expr **)((long)pSVar6->a + lVar12 + -0x20) = pEVar10;
        *(undefined8 *)((long)pSVar6->a + lVar12 + -0x18) =
             *(undefined8 *)((long)p->a + lVar12 + -0x18);
        lVar11 = lVar11 + 1;
        lVar12 = lVar12 + 0x68;
      } while (lVar11 < p->nSrc);
      return pSVar6;
    }
  }
  return (SrcList *)0x0;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListDup(sqlite3 *db, const SrcList *p, int flags){
  SrcList *pNew;
  int i;
  int nByte;
  assert( db!=0 );
  if( p==0 ) return 0;
  nByte = sizeof(*p) + (p->nSrc>0 ? sizeof(p->a[0]) * (p->nSrc-1) : 0);
  pNew = sqlite3DbMallocRawNN(db, nByte );
  if( pNew==0 ) return 0;
  pNew->nSrc = pNew->nAlloc = p->nSrc;
  for(i=0; i<p->nSrc; i++){
    SrcItem *pNewItem = &pNew->a[i];
    const SrcItem *pOldItem = &p->a[i];
    Table *pTab;
    pNewItem->pSchema = pOldItem->pSchema;
    pNewItem->zDatabase = sqlite3DbStrDup(db, pOldItem->zDatabase);
    pNewItem->zName = sqlite3DbStrDup(db, pOldItem->zName);
    pNewItem->zAlias = sqlite3DbStrDup(db, pOldItem->zAlias);
    pNewItem->fg = pOldItem->fg;
    pNewItem->iCursor = pOldItem->iCursor;
    pNewItem->addrFillSub = pOldItem->addrFillSub;
    pNewItem->regReturn = pOldItem->regReturn;
    if( pNewItem->fg.isIndexedBy ){
      pNewItem->u1.zIndexedBy = sqlite3DbStrDup(db, pOldItem->u1.zIndexedBy);
    }
    pNewItem->u2 = pOldItem->u2;
    if( pNewItem->fg.isCte ){
      pNewItem->u2.pCteUse->nUse++;
    }
    if( pNewItem->fg.isTabFunc ){
      pNewItem->u1.pFuncArg =
          sqlite3ExprListDup(db, pOldItem->u1.pFuncArg, flags);
    }
    pTab = pNewItem->pTab = pOldItem->pTab;
    if( pTab ){
      pTab->nTabRef++;
    }
    pNewItem->pSelect = sqlite3SelectDup(db, pOldItem->pSelect, flags);
    if( pOldItem->fg.isUsing ){
      assert( pNewItem->fg.isUsing );
      pNewItem->u3.pUsing = sqlite3IdListDup(db, pOldItem->u3.pUsing);
    }else{
      pNewItem->u3.pOn = sqlite3ExprDup(db, pOldItem->u3.pOn, flags);
    }
    pNewItem->colUsed = pOldItem->colUsed;
  }
  return pNew;
}